

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int update_traffic_key(ptls_t *tls,int is_enc)

{
  ptls_hash_algorithm_t *algo;
  size_t outlen;
  int iVar1;
  anon_struct_176_2_4ca0e81c_for_traffic_protection *paVar2;
  ptls_iovec_t secret_00;
  uint8_t secret [64];
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 uStack_38;
  undefined8 uStack_30;
  
  paVar2 = (anon_struct_176_2_4ca0e81c_for_traffic_protection *)&(tls->traffic_protection).enc;
  if (is_enc == 0) {
    paVar2 = &tls->traffic_protection;
  }
  algo = tls->key_schedule->hashes[0].algo;
  outlen = algo->digest_size;
  secret_00.len = outlen;
  secret_00.base = (uint8_t *)paVar2;
  iVar1 = hkdf_expand_label(algo,&local_68,outlen,secret_00,"traffic upd",(ptls_iovec_t)ZEXT816(0),
                            tls->key_schedule->hkdf_label_prefix);
  if (iVar1 == 0) {
    *(undefined8 *)((paVar2->dec).secret + 0x20) = local_48;
    *(undefined8 *)((paVar2->dec).secret + 0x28) = uStack_40;
    *(undefined8 *)((paVar2->dec).secret + 0x30) = uStack_38;
    *(undefined8 *)((paVar2->dec).secret + 0x38) = uStack_30;
    *(undefined8 *)(paVar2->dec).secret = local_68;
    *(undefined8 *)((paVar2->dec).secret + 8) = uStack_60;
    *(undefined8 *)((paVar2->dec).secret + 0x10) = uStack_58;
    *(undefined8 *)((paVar2->dec).secret + 0x18) = uStack_50;
    iVar1 = setup_traffic_protection(tls,is_enc,(char *)0x0,3,1);
  }
  (*ptls_clear_memory)(&local_68,0x40);
  return iVar1;
}

Assistant:

static int update_traffic_key(ptls_t *tls, int is_enc)
{
    struct st_ptls_traffic_protection_t *tp = is_enc ? &tls->traffic_protection.enc : &tls->traffic_protection.dec;
    uint8_t secret[PTLS_MAX_DIGEST_SIZE];
    int ret;

    ptls_hash_algorithm_t *hash = tls->key_schedule->hashes[0].algo;
    if ((ret = hkdf_expand_label(hash, secret, hash->digest_size, ptls_iovec_init(tp->secret, hash->digest_size), "traffic upd",
                                 ptls_iovec_init(NULL, 0), tls->key_schedule->hkdf_label_prefix)) != 0)
        goto Exit;
    memcpy(tp->secret, secret, sizeof(secret));
    ret = setup_traffic_protection(tls, is_enc, NULL, 3, 1);

Exit:
    ptls_clear_memory(secret, sizeof(secret));
    return ret;
}